

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O2

void cleanup_act(void)

{
  long lVar1;
  ulong uVar2;
  
  lVar1 = 0;
  for (uVar2 = 0; uVar2 < z_info->act_max; uVar2 = uVar2 + 1) {
    string_free(*(char **)((long)&activations->name + lVar1));
    mem_free(*(void **)((long)&activations->desc + lVar1));
    mem_free(*(void **)((long)&activations->message + lVar1));
    free_effect(*(effect **)((long)&activations->effect + lVar1));
    lVar1 = lVar1 + 0x38;
  }
  mem_free(activations);
  return;
}

Assistant:

static void cleanup_act(void)
{
	int idx;
	for (idx = 0; idx < z_info->act_max; idx++) {
		string_free(activations[idx].name);
		mem_free(activations[idx].desc);
		mem_free(activations[idx].message);
		free_effect(activations[idx].effect);
	}
	mem_free(activations);
}